

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# send_functions.hpp
# Opt level: O0

void so_5::impl::instantiator_and_sender_base<so_5::coop_t*,false>::send<so_5::coop_t*&>
               (mbox_t *to,coop_t **args)

{
  message_mutability_t mutability;
  abstract_message_box_t *this;
  unique_ptr<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>_>
  local_28;
  type_index local_20;
  coop_t **local_18;
  coop_t **args_local;
  mbox_t *to_local;
  
  local_18 = args;
  args_local = (coop_t **)to;
  this = intrusive_ptr_t<so_5::abstract_message_box_t>::operator->(to);
  local_20 = message_payload_type_impl<so_5::coop_t_*,_false>::subscription_type_index();
  details::make_message_instance<so_5::coop_t*,so_5::coop_t*&>((details *)&local_28,local_18);
  mutability = message_payload_type_impl<so_5::coop_t_*,_false>::mutability();
  abstract_message_box_t::deliver_message<so_5::user_type_message_t<so_5::coop_t*>>
            (this,local_20,&local_28,mutability);
  std::
  unique_ptr<so_5::user_type_message_t<so_5::coop_t_*>,_std::default_delete<so_5::user_type_message_t<so_5::coop_t_*>_>_>
  ::~unique_ptr(&local_28);
  return;
}

Assistant:

static void
			send(
				const so_5::mbox_t & to,
				ARGS &&... args )
				{
					to->deliver_message(
						message_payload_type< MESSAGE >::subscription_type_index(),
						so_5::details::make_message_instance< MESSAGE >(
								std::forward< ARGS >( args )...),
						message_payload_type< MESSAGE >::mutability() );
				}